

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cc
# Opt level: O2

vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
* __thiscall
t_container::f_define
          (vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
           *__return_storage_ptr__,t_container *this)

{
  pointer ppVar1;
  t_object *a_value;
  t_define<t_container> *ptVar2;
  wstring_view a_name;
  atomic<xemmai::t_object_*> local_58;
  t_define<t_container> local_50;
  
  a_value = xemmai::t_type_of<t_pair>::f_define(this);
  xemmai::t_slot_of<xemmai::t_type_of<xemmai::t_object>_>::f_construct(&this->v_type_pair,a_value);
  xemmai::t_type_of<t_queue>::f_define(this);
  local_50.v_fields.v_instance.super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.v_fields.v_instance.super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.v_fields.v_instance.super__Vector_base<xemmai::t_root,_std::allocator<xemmai::t_root>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50.v_fields.v_class.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.v_fields.v_class.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.v_fields.v_class.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_b._M_p = (__base_type)(this->v_type_queue).v_slot.v_p._M_b._M_p;
  a_name._M_str = L"Queue";
  a_name._M_len = 5;
  local_50.v_library = this;
  ptVar2 = xemmai::t_define<t_container>::operator()(&local_50,a_name,(t_object **)&local_58);
  ppVar1 = (ptVar2->v_fields).v_class.
           super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       (ptVar2->v_fields).v_class.
       super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = ppVar1;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       (ptVar2->v_fields).v_class.
       super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (ptVar2->v_fields).v_class.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (ptVar2->v_fields).v_class.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (ptVar2->v_fields).v_class.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  xemmai::t_fields::~t_fields(&local_50.v_fields);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<t_root, t_rvalue>> t_container::f_define()
{
	v_type_pair.f_construct(t_type_of<t_pair>::f_define(this));
	t_type_of<t_queue>::f_define(this);
	return t_define(this)
	(L"Queue"sv, static_cast<t_object*>(v_type_queue))
	;
}